

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O1

void test_for_append(bsdtar *bsdtar)

{
  int iVar1;
  char *fmt;
  stat s;
  stat sStack_98;
  
  if ((*bsdtar->argv == (char *)0x0) && (bsdtar->names_from_file == (char *)0x0)) {
    fmt = "no files or directories specified";
  }
  else {
    if (bsdtar->filename != (char *)0x0) {
      iVar1 = stat(bsdtar->filename,&sStack_98);
      if (((iVar1 == 0) && ((sStack_98.st_mode & 0xf000) != 0x6000)) &&
         ((sStack_98.st_mode & 0xf000) != 0x8000)) {
        lafe_errc(1,0,"Cannot append to %s: not a regular file.",bsdtar->filename);
      }
      return;
    }
    fmt = "Cannot append to stdout.";
  }
  lafe_errc(1,0,fmt);
}

Assistant:

static void
test_for_append(struct bsdtar *bsdtar)
{
	struct stat s;

	if (*bsdtar->argv == NULL && bsdtar->names_from_file == NULL)
		lafe_errc(1, 0, "no files or directories specified");
	if (bsdtar->filename == NULL)
		lafe_errc(1, 0, "Cannot append to stdout.");

	if (stat(bsdtar->filename, &s) != 0)
		return;

	if (!S_ISREG(s.st_mode) && !S_ISBLK(s.st_mode))
		lafe_errc(1, 0,
		    "Cannot append to %s: not a regular file.",
		    bsdtar->filename);

/* Is this an appropriate check here on Windows? */
/*
	if (GetFileType(handle) != FILE_TYPE_DISK)
		lafe_errc(1, 0, "Cannot append");
*/

}